

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O1

void cl_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  
  if (req == (uv_udp_send_t *)0x0) {
    cl_send_cb_cold_3();
  }
  else if (status == 0) {
    if (req->handle == &client || req->handle == &server) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return;
    }
    goto LAB_0017c615;
  }
  cl_send_cb_cold_1();
LAB_0017c615:
  cl_send_cb_cold_2();
  if (req == (uv_udp_send_t *)&client || req == (uv_udp_send_t *)&server) {
    iVar1 = uv_is_closing();
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(req,0);
  return;
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);
  if (++cl_send_cb_called == 1) {
    uv_udp_connect(&client, NULL);
    r = uv_udp_send(req, &client, &buf, 1, NULL, cl_send_cb);
    ASSERT(r == UV_EDESTADDRREQ);
    r = uv_udp_send(req,
                    &client,
                    &buf,
                    1,
                    (const struct sockaddr*) &lo_addr,
                    cl_send_cb);
    ASSERT(r == 0);
  }

}